

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_generic_fp-inl.h
# Opt level: O1

bool anon_unknown.dwarf_cae5::stacktrace_generic_fp::CheckPageIsReadable
               (void *ptr,void *checked_ptr)

{
  undefined1 uVar1;
  int iVar2;
  ulong uVar3;
  
  if (CheckPageIsReadable::pagesize == 0) {
    iVar2 = getpagesize();
    CheckPageIsReadable::pagesize = (uintptr_t)iVar2;
  }
  uVar3 = (ulong)checked_ptr & -CheckPageIsReadable::pagesize;
  if (uVar3 != 0 && (-CheckPageIsReadable::pagesize & (ulong)ptr) == uVar3) {
    return true;
  }
  uVar1 = (*(code *)(anonymous_namespace)::CheckAddress)();
  return (bool)uVar1;
}

Assistant:

bool CheckPageIsReadable(void* ptr, void* checked_ptr) {
  static uintptr_t pagesize;
  if (pagesize == 0) {
    pagesize = getpagesize();
  }

  uintptr_t addr = reinterpret_cast<uintptr_t>(ptr);
  uintptr_t parent_frame = reinterpret_cast<uintptr_t>(checked_ptr);

  parent_frame &= ~(pagesize - 1);
  addr &= ~(pagesize - 1);

  if (parent_frame != 0 && addr == parent_frame) {
    return true;
  }

  return CheckAddress(addr, pagesize);
}